

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_MethodFeaturesOverride_Test::
FeaturesTest_MethodFeaturesOverride_Test(FeaturesTest_MethodFeaturesOverride_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018dcb88;
  return;
}

Assistant:

TEST_F(FeaturesTest, MethodFeaturesOverride) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    message_type { name: "EmptyMsg" }
    options {
      features {
        enum_type: CLOSED
        [pb.test] { multiple_feature: VALUE2 }
      }
    }
    service {
      name: "Foo"
      options {
        features {
          [pb.test] { service_feature: VALUE4 multiple_feature: VALUE4 }
        }
      }
      method {
        name: "Bar"
        input_type: "EmptyMsg"
        output_type: "EmptyMsg"
        options {
          features {
            [pb.test] { multiple_feature: VALUE9 }
          }
        }
      }
    }
  )pb");
  const MethodDescriptor* method = file->service(0)->method(0);
  EXPECT_THAT(method->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(method).enum_type(), FeatureSet::CLOSED);
  EXPECT_EQ(GetFeatures(method).GetExtension(pb::test).service_feature(),
            pb::VALUE4);
  EXPECT_EQ(GetFeatures(method).GetExtension(pb::test).multiple_feature(),
            pb::VALUE9);
}